

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

void __thiscall Fl_Window_Type::write_code2(Fl_Window_Type *this)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  Fl_Widget *pFVar4;
  char *local_30;
  char *local_28;
  char *var;
  Fl_Window_Type *this_local;
  
  iVar1 = (*(this->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x26])();
  if (iVar1 == 0) {
    pcVar3 = Fl_Type::name((Fl_Type *)this);
    if (pcVar3 == (char *)0x0) {
      local_30 = "o";
    }
    else {
      local_30 = Fl_Type::name((Fl_Type *)this);
    }
    local_28 = local_30;
  }
  else {
    local_28 = "this";
  }
  Fl_Widget_Type::write_extra_code(&this->super_Fl_Widget_Type);
  if (this->modal == '\0') {
    if (this->non_modal != '\0') {
      pcVar3 = indent();
      write_c("%s%s->set_non_modal();\n",pcVar3,local_28);
    }
  }
  else {
    pcVar3 = indent();
    write_c("%s%s->set_modal();\n",pcVar3,local_28);
  }
  uVar2 = Fl_Window::border((Fl_Window *)(this->super_Fl_Widget_Type).o);
  if (uVar2 == 0) {
    pcVar3 = indent();
    write_c("%s%s->clear_border();\n",pcVar3,local_28);
  }
  if ((this->super_Fl_Widget_Type).xclass != (char *)0x0) {
    pcVar3 = indent();
    write_c("%s%s->xclass(",pcVar3,local_28);
    write_cstring((this->super_Fl_Widget_Type).xclass);
    write_c(");\n");
  }
  if ((this->sr_max_w == 0) && (this->sr_max_h == 0)) {
    if ((this->sr_min_w != 0) || (this->sr_min_h != 0)) {
      pcVar3 = indent();
      write_c("%s%s->size_range(%d, %d);\n",pcVar3,local_28,(ulong)(uint)this->sr_min_w,
              (ulong)(uint)this->sr_min_h);
    }
  }
  else {
    pcVar3 = indent();
    write_c("%s%s->size_range(%d, %d, %d, %d);\n",pcVar3,local_28,(ulong)(uint)this->sr_min_w,
            (ulong)(uint)this->sr_min_h,(ulong)(uint)this->sr_max_w,this->sr_max_h);
  }
  pcVar3 = indent();
  write_c("%s%s->end();\n",pcVar3,local_28);
  pFVar4 = Fl_Group::resizable((Fl_Group *)(this->super_Fl_Widget_Type).o);
  if (pFVar4 == (this->super_Fl_Widget_Type).o) {
    pcVar3 = indent();
    write_c("%s%s->resizable(%s);\n",pcVar3,local_28,local_28);
  }
  Fl_Widget_Type::write_block_close(&this->super_Fl_Widget_Type);
  return;
}

Assistant:

void Fl_Window_Type::write_code2() {
  const char *var = is_class() ? "this" : name() ? name() : "o";
  write_extra_code();
  if (modal) write_c("%s%s->set_modal();\n", indent(), var);
  else if (non_modal) write_c("%s%s->set_non_modal();\n", indent(), var);
  if (!((Fl_Window*)o)->border()) {
    write_c("%s%s->clear_border();\n", indent(), var);
  }
  if (xclass) {
    write_c("%s%s->xclass(", indent(), var);
    write_cstring(xclass);
    write_c(");\n");
  }
  if (sr_max_w || sr_max_h) {
    write_c("%s%s->size_range(%d, %d, %d, %d);\n", indent(), var,
            sr_min_w, sr_min_h, sr_max_w, sr_max_h);
  } else if (sr_min_w || sr_min_h) {
    write_c("%s%s->size_range(%d, %d);\n", indent(), var, sr_min_w, sr_min_h);
  }
  write_c("%s%s->end();\n", indent(), var);
  if (((Fl_Window*)o)->resizable() == o)
    write_c("%s%s->resizable(%s);\n", indent(), var, var);
  write_block_close();
}